

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
duckdb_re2::DFA::InlinedSearchLoop<false,false,false>(DFA *this,SearchParams *params)

{
  byte bVar1;
  byte *pbVar2;
  Prog *pPVar3;
  const_pointer pcVar4;
  bool bVar5;
  byte *pbVar6;
  bool bVar7;
  uint uVar8;
  State *pSVar9;
  State *pSVar10;
  State *state;
  uint c;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  StateSaver save_start;
  StateSaver save_s;
  byte *local_230;
  byte *local_208;
  StateSaver local_200;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [376];
  
  pbVar2 = (byte *)(params->text).data_;
  pSVar10 = params->start;
  pbVar12 = pbVar2 + (params->text).size_;
  pPVar3 = this->prog_;
  if ((pSVar10->flag_ & 0x100) == 0) {
    bVar7 = false;
    local_230 = (byte *)0x0;
  }
  else {
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar11 = (ulong)(uint)pSVar10->ninst_;
          (0 < (int)uVar11 && (pSVar10->inst_[uVar11 - 1] != -2)); uVar11 = uVar11 - 1) {
        SparseSetT<void>::insert(params->matches,pSVar10->inst_[uVar11 - 1]);
      }
    }
    bVar7 = true;
    local_230 = pbVar12;
  }
  local_208 = (byte *)0x0;
  pSVar9 = pSVar10;
  do {
    pbVar13 = pbVar12 + -1;
    state = pSVar9;
    pbVar6 = pbVar13;
    do {
      pbVar12 = pbVar6;
      if (pbVar12 + 1 == pbVar2) {
        pcVar4 = (params->text).data_;
        if (pcVar4 == (params->context).data_) {
          uVar8 = this->prog_->bytemap_range_;
          c = 0x100;
        }
        else {
          bVar1 = pcVar4[-1];
          c = (uint)bVar1;
          uVar8 = (uint)this->prog_->bytemap_[bVar1];
        }
        pSVar10 = state->next_[(int)uVar8]._M_b._M_p;
        if ((pSVar10 == (State *)0x0) &&
           (pSVar10 = RunStateOnByteUnlocked(this,state,c), pSVar10 == (State *)0x0)) {
          StateSaver::StateSaver(&local_200,this,state);
          ResetCache(this,params->cache_lock);
          pSVar10 = StateSaver::Restore(&local_200);
          if (pSVar10 == (State *)0x0) {
LAB_01eca5f7:
            params->failed = true;
            bVar5 = false;
            pSVar10 = (State *)0x0;
          }
          else {
            pSVar10 = RunStateOnByteUnlocked(this,pSVar10,c);
            if (pSVar10 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::operator<<((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset");
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              goto LAB_01eca5f7;
            }
            bVar5 = true;
          }
          StateSaver::~StateSaver(&local_200);
          if (!bVar5) {
            return false;
          }
        }
        if (pSVar10 < (State *)0x3) {
          if (pSVar10 == (State *)0x1) goto LAB_01eca67a;
          params->ep = (char *)pbVar2;
LAB_01eca668:
          bVar7 = true;
        }
        else {
          if ((((pSVar10->flag_ & 0x100) != 0) &&
              (bVar7 = true, local_230 = pbVar2, params->matches != (SparseSet *)0x0)) &&
             (this->kind_ == kManyMatch)) {
            for (uVar11 = (ulong)(uint)pSVar10->ninst_;
                (0 < (int)uVar11 && (pSVar10->inst_[uVar11 - 1] != -2)); uVar11 = uVar11 - 1) {
              SparseSetT<void>::insert(params->matches,pSVar10->inst_[uVar11 - 1]);
            }
          }
LAB_01eca67a:
          params->ep = (char *)local_230;
        }
        return bVar7;
      }
      bVar1 = *pbVar12;
      pSVar9 = state->next_[pPVar3->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar9 == (State *)0x0) {
        pSVar9 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
        if (pSVar9 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (local_208 != (byte *)0x0)) &&
             (((ulong)((long)pbVar13 - (long)local_208) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          StateSaver::StateSaver(&local_200,this,pSVar10);
          StateSaver::StateSaver(&local_1d8,this,state);
          ResetCache(this,params->cache_lock);
          pSVar10 = StateSaver::Restore(&local_200);
          if ((pSVar10 == (State *)0x0) ||
             (pSVar9 = StateSaver::Restore(&local_1d8), pSVar9 == (State *)0x0)) {
LAB_01eca442:
            params->failed = true;
            bVar5 = false;
            pSVar9 = (State *)0x0;
          }
          else {
            pSVar9 = RunStateOnByteUnlocked(this,pSVar9,(uint)bVar1);
            if (pSVar9 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::operator<<((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache")
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              goto LAB_01eca442;
            }
            bVar5 = true;
          }
          StateSaver::~StateSaver(&local_1d8);
          StateSaver::~StateSaver(&local_200);
          local_208 = pbVar12;
          if (!bVar5) {
            return false;
          }
        }
      }
      if (pSVar9 < (State *)0x3) {
        if (pSVar9 == (State *)0x1) {
          params->ep = (char *)local_230;
          return bVar7;
        }
        params->ep = (char *)pbVar2;
        goto LAB_01eca668;
      }
      pbVar13 = pbVar13 + -1;
      state = pSVar9;
      pbVar6 = pbVar12 + -1;
    } while ((pSVar9->flag_ & 0x100) == 0);
    local_230 = pbVar12 + 1;
    bVar7 = true;
    if ((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) {
      for (uVar11 = (ulong)(uint)pSVar9->ninst_;
          (0 < (int)uVar11 && (pSVar9->inst_[uVar11 - 1] != -2)); uVar11 = uVar11 - 1) {
        SparseSetT<void>::insert(params->matches,pSVar9->inst_[uVar11 - 1]);
      }
    }
  } while( true );
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}